

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_tools.cpp
# Opt level: O1

ON_Mesh * ON_ControlPolygonMesh(ON_NurbsSurface *nurbs_surface,bool bCleanMesh,ON_Mesh *input_mesh)

{
  undefined8 *puVar1;
  int iVar2;
  undefined8 uVar3;
  float fVar4;
  char cVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  double *pdVar10;
  ON_Mesh *pOVar11;
  ON_SimpleArray<ON_3dPoint> *this;
  ON_3dPoint *pOVar12;
  ON_3fVector *pOVar13;
  ON_2dPoint *pOVar14;
  ON_2fPoint *this_00;
  ON_MeshFace *pOVar15;
  ulong uVar16;
  undefined7 in_register_00000031;
  long lVar17;
  long lVar18;
  ulong uVar19;
  double dVar20;
  long lVar21;
  size_t new_capacity;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  double in_XMM1_Qa;
  ON_SimpleArray<double> gv;
  ON_SimpleArray<double> gu;
  ON_Interval d1;
  ON_Interval d0;
  ON_SimpleArray<int> badfi;
  ON_3dPoint V;
  int hint [2];
  ON_2dPoint T;
  ON_3dPoint P [4];
  ON_3dVector N;
  uint local_1f0;
  char local_1eb;
  char local_1ea;
  char local_1e9;
  ON_Mesh *local_1e8;
  char local_1dd;
  uint local_1dc;
  ulong local_1d8;
  ulong local_1d0;
  double local_1c8;
  ON_NurbsSurface *local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  ON_SimpleArray<double> local_1a8;
  ON_SimpleArray<double> local_190;
  ON_Mesh *local_178;
  ulong local_170;
  undefined4 local_164;
  ulong local_160;
  ON_SimpleArray<ON_MeshFace> *local_158;
  ON_SimpleArray<ON_3fVector> *local_150;
  ON_3dPoint local_148;
  ON_Interval local_130;
  ON_Interval local_120;
  ON_SimpleArray<int> local_110;
  ON_3dPoint local_f8;
  ulong local_d8;
  ulong local_d0;
  double local_c8;
  int local_c0 [2];
  ON_2dPoint local_b8;
  ON_3dPoint local_a8;
  ON_3dPoint local_90;
  ON_3dPoint local_78;
  ON_3dPoint local_60;
  ON_3dVector local_48;
  
  uVar7 = ON_NurbsSurface::CVCount(nurbs_surface,0);
  uVar19 = (ulong)uVar7;
  uVar8 = ON_NurbsSurface::CVCount(nurbs_surface,1);
  if (nurbs_surface->m_cv != (double *)0x0) {
    iVar9 = (*(nurbs_surface->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6]
            )(nurbs_surface);
    if ((char)iVar9 != '\0') {
      local_190._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00818f10;
      local_190.m_a = (double *)0x0;
      local_190.m_count = 0;
      local_190.m_capacity = 0;
      if (uVar7 != 0) {
        ON_SimpleArray<double>::SetCapacity(&local_190,(long)(int)uVar7);
      }
      local_1a8._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00818f10;
      local_1a8.m_a = (double *)0x0;
      local_1a8.m_count = 0;
      local_1a8.m_capacity = 0;
      if (uVar8 != 0) {
        ON_SimpleArray<double>::SetCapacity(&local_1a8,(long)(int)uVar8);
      }
      if ((-1 < (int)uVar7) && ((int)uVar7 <= local_190.m_capacity)) {
        local_190.m_count = uVar7;
      }
      if ((-1 < (int)uVar8) && ((int)uVar8 <= local_1a8.m_capacity)) {
        local_1a8.m_count = uVar8;
      }
      ON_NurbsSurface::GetGrevilleAbcissae(nurbs_surface,0,local_190.m_a);
      ON_NurbsSurface::GetGrevilleAbcissae(nurbs_surface,1,local_1a8.m_a);
      (*(nurbs_surface->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                (nurbs_surface,0);
      local_120.m_t[0] = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      local_120.m_t[1] = in_XMM1_Qa;
      (*(nurbs_surface->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                (nurbs_surface,1);
      local_130.m_t[0] = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
      local_130.m_t[1] = in_XMM1_Qa;
      iVar9 = (*(nurbs_surface->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                [0x31])(nurbs_surface,0);
      local_1ea = '\x01';
      cVar5 = (char)iVar9;
      if (cVar5 == '\0') {
        iVar9 = (*(nurbs_surface->super_ON_Surface).super_ON_Geometry.super_ON_Object.
                  _vptr_ON_Object[0x30])(nurbs_surface,0);
        local_1ea = (char)iVar9;
      }
      local_164 = (undefined4)CONCAT71(in_register_00000031,bCleanMesh);
      iVar9 = (*(nurbs_surface->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                [0x31])(nurbs_surface);
      local_1eb = '\x01';
      local_1e9 = (char)iVar9;
      if (local_1e9 == '\0') {
        iVar9 = (*(nurbs_surface->super_ON_Surface).super_ON_Geometry.super_ON_Object.
                  _vptr_ON_Object[0x30])(nurbs_surface);
        local_1eb = (char)iVar9;
      }
      uVar16 = 0;
      local_1d0 = 0;
      dVar20 = (double)(ulong)uVar8;
      local_1dd = cVar5;
      local_1c0 = nurbs_surface;
      local_178 = input_mesh;
      if (cVar5 != '\0') {
        iVar9 = (*(nurbs_surface->super_ON_Surface).super_ON_Geometry.super_ON_Object.
                  _vptr_ON_Object[0x2b])(nurbs_surface);
        uVar7 = (uVar7 - iVar9) + 1;
        local_1b8 = (ulong)uVar7;
        lVar18 = (long)(int)uVar7;
        lVar21 = lVar18 << 0x20;
        local_1d0 = 0;
        local_1c8 = (double)(ulong)uVar8;
        while (iVar9 = ON_NurbsSurface::CVCount(local_1c0,0),
              (long)(lVar18 + local_1d0) < (long)iVar9) {
          local_1e8 = (ON_Mesh *)local_190.m_a[local_1d0];
          pdVar10 = ON_Interval::operator[](&local_120,0);
          if (*pdVar10 <= (double)local_1e8) break;
          local_1e8 = (ON_Mesh *)local_190.m_a[lVar18 + (local_1d0 - 1)];
          pdVar10 = ON_Interval::operator[](&local_120,1);
          if (*pdVar10 < (double)local_1e8) break;
          local_1d0 = local_1d0 + 1;
          lVar21 = lVar21 + 0x100000000;
        }
        ON_Interval::Set(&local_120,local_190.m_a[local_1d0],
                         *(double *)((long)local_190.m_a + (lVar21 >> 0x1d) + -8));
        uVar19 = (local_1b8 & 0xffffffff) + local_1d0;
        dVar20 = local_1c8;
      }
      local_1b8 = uVar19;
      if (local_1e9 != '\0') {
        iVar9 = (*(local_1c0->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                  [0x2b])(local_1c0,1);
        uVar7 = (SUB84(dVar20,0) - iVar9) + 1;
        local_1c8 = (double)(ulong)uVar7;
        lVar18 = (long)(int)uVar7;
        lVar21 = lVar18 << 0x20;
        for (uVar16 = 0; iVar9 = ON_NurbsSurface::CVCount(local_1c0,1),
            (long)(lVar18 + uVar16) < (long)iVar9; uVar16 = uVar16 + 1) {
          local_1e8 = (ON_Mesh *)local_1a8.m_a[uVar16];
          pdVar10 = ON_Interval::operator[](&local_130,0);
          if (*pdVar10 <= (double)local_1e8) break;
          local_1e8 = (ON_Mesh *)local_1a8.m_a[lVar18 + (uVar16 - 1)];
          pdVar10 = ON_Interval::operator[](&local_130,1);
          if (*pdVar10 < (double)local_1e8) break;
          lVar21 = lVar21 + 0x100000000;
        }
        ON_Interval::Set(&local_130,local_1a8.m_a[uVar16],
                         *(double *)((long)local_1a8.m_a + (lVar21 >> 0x1d) + -8));
        dVar20 = (double)(((ulong)local_1c8 & 0xffffffff) + uVar16);
      }
      pOVar11 = local_178;
      local_1c8 = dVar20;
      if (local_178 == (ON_Mesh *)0x0) {
        pOVar11 = (ON_Mesh *)operator_new(0x6e0);
        ON_Mesh::ON_Mesh(pOVar11);
      }
      this = &ON_Mesh::DoublePrecisionVertices(pOVar11)->super_ON_SimpleArray<ON_3dPoint>;
      uVar7 = (int)local_1b8 - (int)local_1d0;
      local_1d8 = (ulong)uVar7;
      local_1dc = SUB84(local_1c8,0) - (int)uVar16;
      local_170 = (ulong)local_1dc;
      local_1dc = local_1dc * uVar7;
      new_capacity = (size_t)(int)local_1dc;
      if ((uint)this->m_capacity < local_1dc) {
        ON_SimpleArray<ON_3dPoint>::SetCapacity(this,new_capacity);
      }
      local_150 = &(pOVar11->m_N).super_ON_SimpleArray<ON_3fVector>;
      if ((uint)(pOVar11->m_N).super_ON_SimpleArray<ON_3fVector>.m_capacity < local_1dc) {
        ON_SimpleArray<ON_3fVector>::SetCapacity(local_150,new_capacity);
      }
      if ((uint)(pOVar11->m_T).super_ON_SimpleArray<ON_2fPoint>.m_capacity < local_1dc) {
        ON_SimpleArray<ON_2fPoint>::SetCapacity
                  (&(pOVar11->m_T).super_ON_SimpleArray<ON_2fPoint>,new_capacity);
      }
      if ((uint)(pOVar11->m_S).super_ON_SimpleArray<ON_2dPoint>.m_capacity < local_1dc) {
        ON_SimpleArray<ON_2dPoint>::SetCapacity
                  (&(pOVar11->m_S).super_ON_SimpleArray<ON_2dPoint>,new_capacity);
      }
      uVar8 = (int)local_1d8 - 1;
      local_160 = (ulong)uVar8;
      uVar7 = (int)local_170 - 1;
      local_1b0 = (ulong)uVar7;
      uVar7 = uVar7 * uVar8;
      local_158 = &pOVar11->m_F;
      if ((uint)(pOVar11->m_F).m_capacity < uVar7) {
        ON_SimpleArray<ON_MeshFace>::SetCapacity(local_158,(long)(int)uVar7);
      }
      *(double *)&pOVar11->field_0x240 = local_120.m_t[0];
      *(double *)&pOVar11->field_0x248 = local_120.m_t[1];
      *(double *)&pOVar11->field_0x250 = local_130.m_t[0];
      *(double *)&pOVar11->field_0x258 = local_130.m_t[1];
      local_c0[0] = 0;
      local_c0[1] = 0;
      local_1e8 = pOVar11;
      if ((int)uVar16 < SUB84(local_1c8,0)) {
        uVar16 = uVar16 & 0xffffffff;
        local_d8 = (ulong)local_1c8 & 0xffffffff;
        iVar9 = -1;
        local_d0 = uVar16;
        do {
          local_c8 = local_1a8.m_a[uVar16];
          local_b8.y = ON_Interval::NormalizedParameterAt(&local_130,local_c8);
          local_1f0 = (uint)local_1d0;
          if ((int)local_1f0 < (int)local_1b8) {
            uVar19 = local_1d0 & 0xffffffff;
            do {
              ON_NurbsSurface::GetCV(local_1c0,(int)uVar19,(int)uVar16,&local_f8);
              local_1c8 = local_190.m_a[(int)local_1f0];
              local_b8.x = ON_Interval::NormalizedParameterAt(&local_120,local_1c8);
              ON_Surface::EvNormal
                        (&local_1c0->super_ON_Surface,local_190.m_a[(int)local_1f0],
                         local_1a8.m_a[uVar16],&local_48,0,local_c0);
              pOVar12 = ON_SimpleArray<ON_3dPoint>::AppendNew(this);
              pOVar12->z = local_f8.z;
              pOVar12->x = local_f8.x;
              pOVar12->y = local_f8.y;
              pOVar13 = ON_SimpleArray<ON_3fVector>::AppendNew(local_150);
              ON_3fVector::operator=(pOVar13,&local_48);
              pOVar14 = ON_SimpleArray<ON_2dPoint>::AppendNew
                                  (&(pOVar11->m_S).super_ON_SimpleArray<ON_2dPoint>);
              pOVar14->x = local_1c8;
              pOVar14->y = local_c8;
              this_00 = ON_SimpleArray<ON_2fPoint>::AppendNew
                                  (&(pOVar11->m_T).super_ON_SimpleArray<ON_2fPoint>);
              ON_2fPoint::operator=(this_00,&local_b8);
              if (((int)local_1d0 < (int)local_1f0) && (local_d0 < uVar16)) {
                pOVar15 = ON_SimpleArray<ON_MeshFace>::AppendNew(local_158);
                pOVar15->vi[0] = iVar9;
                iVar9 = iVar9 + 1;
                pOVar15->vi[1] = iVar9;
                iVar2 = this->m_count;
                pOVar15->vi[2] = iVar2 + -1;
                pOVar15->vi[3] = iVar2 + -2;
              }
              local_1f0 = local_1f0 + 1;
              uVar19 = (ulong)local_1f0;
            } while ((int)local_1f0 < (int)local_1b8);
          }
          iVar9 = iVar9 + 1;
          uVar16 = uVar16 + 1;
        } while (uVar16 != local_d8);
      }
      pOVar11 = local_1e8;
      ON_Mesh::UpdateSinglePrecisionVertices(local_1e8);
      cVar5 = local_1e9;
      if (local_1ea != '\0') {
        local_1f0 = 0;
        if ((int)local_170 < 1) {
          uVar16 = 0;
        }
        else {
          uVar19 = local_170 & 0xffffffff;
          do {
            uVar7 = local_1f0;
            ON_Mesh::Vertex(&local_a8,pOVar11,local_1f0);
            iVar9 = uVar7 + (int)local_160;
            ON_Mesh::SetVertex(pOVar11,iVar9,&local_a8);
            if (local_1dd != '\0') {
              pOVar13 = (pOVar11->m_N).super_ON_SimpleArray<ON_3fVector>.m_a;
              pOVar13[iVar9].z = pOVar13[(int)local_1f0].z;
              fVar4 = pOVar13[(int)local_1f0].y;
              pOVar13[iVar9].x = pOVar13[(int)local_1f0].x;
              pOVar13[iVar9].y = fVar4;
            }
            local_1f0 = uVar7 + (int)local_1d8;
            uVar7 = (int)uVar19 - 1;
            uVar19 = (ulong)uVar7;
            uVar16 = local_170;
          } while (uVar7 != 0);
        }
      }
      if (local_1eb != '\0') {
        local_1f0 = 0;
        if (0 < (int)local_1d8) {
          iVar9 = (int)local_1b0 * (int)local_1d8;
          lVar18 = (long)iVar9 * 0xc;
          do {
            ON_Mesh::Vertex(&local_a8,pOVar11,local_1f0);
            ON_Mesh::SetVertex(pOVar11,iVar9,&local_a8);
            if (cVar5 != '\0') {
              pOVar13 = (pOVar11->m_N).super_ON_SimpleArray<ON_3fVector>.m_a;
              *(float *)((long)&pOVar13->z + lVar18) = pOVar13[(int)local_1f0].z;
              *(undefined8 *)((long)&pOVar13->x + lVar18) =
                   *(undefined8 *)(pOVar13 + (int)local_1f0);
            }
            local_1f0 = local_1f0 + 1;
            iVar9 = iVar9 + 1;
            lVar18 = lVar18 + 0xc;
          } while ((int)local_1f0 < (int)local_1d8);
        }
      }
      local_1f0 = 0;
      uVar7 = (int)local_1b0 * (int)local_1d8;
      local_1b0 = (ulong)uVar7;
      uVar19 = 0;
      do {
        uVar8 = (uint)uVar19;
        iVar9 = (*(local_1c0->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                  [0x32])(local_1c0,uVar19);
        if ((char)iVar9 != '\0') {
          switch(uVar19) {
          case 0:
            local_1f0 = 0;
            uVar16 = 1;
            uVar8 = (uint)local_1d8;
            break;
          case 1:
            local_1f0 = (uint)local_160;
            uVar16 = local_1d8;
            uVar8 = local_1dc;
            break;
          case 2:
            local_1f0 = (uint)local_1b0;
            uVar16 = 1;
            uVar8 = local_1dc;
            break;
          case 3:
            local_1f0 = 0;
            uVar16 = local_1d8;
            uVar8 = uVar7 + 1;
          }
          ON_Mesh::Vertex(&local_a8,local_1e8,local_1f0);
          local_f8.z = local_a8.z;
          local_f8.x = local_a8.x;
          local_f8.y = local_a8.y;
          while (local_1f0 = local_1f0 + (int)uVar16, (int)local_1f0 < (int)uVar8) {
            ON_Mesh::SetVertex(local_1e8,local_1f0,&local_f8);
          }
        }
        uVar19 = (ulong)(uVar8 + 1);
      } while ((int)uVar8 < 3);
      pOVar11 = local_1e8;
      if ((char)local_164 != '\0') {
        local_110._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008176a8;
        local_110.m_a = (int *)0x0;
        local_110.m_count = 0;
        local_110.m_capacity = 0;
        ON_SimpleArray<int>::SetCapacity(&local_110,0x20);
        local_1f0 = 0;
        iVar9 = (local_1e8->m_F).m_count;
        if (0 < iVar9) {
          do {
            pOVar11 = local_1e8;
            pOVar15 = (local_1e8->m_F).m_a;
            lVar18 = (long)(int)local_1f0;
            ON_Mesh::Vertex(&local_148,local_1e8,pOVar15[lVar18].vi[0]);
            pOVar15 = pOVar15 + lVar18;
            local_a8.z = local_148.z;
            local_a8.x = local_148.x;
            local_a8.y = local_148.y;
            ON_Mesh::Vertex(&local_148,pOVar11,pOVar15->vi[1]);
            local_90.z = local_148.z;
            local_90.x = local_148.x;
            local_90.y = local_148.y;
            ON_Mesh::Vertex(&local_148,pOVar11,pOVar15->vi[2]);
            local_78.z = local_148.z;
            local_78.x = local_148.x;
            local_78.y = local_148.y;
            ON_Mesh::Vertex(&local_148,pOVar11,pOVar15->vi[3]);
            local_60.z = local_148.z;
            local_60.x = local_148.x;
            local_60.y = local_148.y;
            bVar6 = ON_3dPoint::operator==(&local_a8,&local_90);
            if (bVar6) {
              *(undefined8 *)(pOVar15->vi + 1) = *(undefined8 *)(pOVar15->vi + 2);
              local_90.z = local_78.z;
              local_90.x = local_78.x;
              local_90.y = local_78.y;
              local_78.x = local_60.x;
              local_78.y = local_60.y;
              local_78.z = local_60.z;
            }
            bVar6 = ON_3dPoint::operator==(&local_90,&local_78);
            if (bVar6) {
              pOVar15->vi[2] = pOVar15->vi[3];
              local_78.z = local_60.z;
              local_78.x = local_60.x;
              local_78.y = local_60.y;
            }
            bVar6 = ON_3dPoint::operator==(&local_78,&local_60);
            if (bVar6) {
              pOVar15->vi[2] = pOVar15->vi[3];
              local_78.z = local_60.z;
              local_78.x = local_60.x;
              local_78.y = local_60.y;
            }
            bVar6 = ON_3dPoint::operator==(&local_60,&local_a8);
            if (bVar6) {
              *(undefined8 *)pOVar15->vi = *(undefined8 *)(pOVar15->vi + 1);
              pOVar15->vi[2] = pOVar15->vi[3];
              local_a8.z = local_90.z;
              local_a8.x = local_90.x;
              local_a8.y = local_90.y;
              local_90.z = local_78.z;
              local_90.x = local_78.x;
              local_90.y = local_78.y;
              local_78.x = local_60.x;
              local_78.y = local_60.y;
              local_78.z = local_60.z;
            }
            if ((((pOVar15->vi[0] == pOVar15->vi[1]) || (pOVar15->vi[1] == pOVar15->vi[2])) ||
                (pOVar15->vi[3] == pOVar15->vi[0])) ||
               ((bVar6 = ON_3dPoint::operator==(&local_a8,&local_78), bVar6 ||
                (bVar6 = ON_3dPoint::operator==(&local_90,&local_60), bVar6)))) {
              ON_SimpleArray<int>::Append(&local_110,(int *)&local_1f0);
            }
            local_1f0 = local_1f0 + 1;
            iVar9 = (local_1e8->m_F).m_count;
          } while ((int)local_1f0 < iVar9);
        }
        pOVar11 = local_1e8;
        if (0 < local_110.m_count) {
          if (local_110.m_count == iVar9) {
            if (local_178 == (ON_Mesh *)0x0) {
              (*(local_1e8->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(local_1e8);
            }
            else {
              ON_Mesh::Destroy(local_1e8);
            }
            pOVar11 = (ON_Mesh *)0x0;
          }
          else {
            uVar7 = *local_110.m_a;
            local_1f0 = uVar7;
            if ((int)(uVar7 + 1) < (local_1e8->m_F).m_count) {
              lVar18 = (long)(int)uVar7 + 1;
              iVar9 = 1;
              lVar21 = (long)(int)uVar7 << 4;
              do {
                if ((iVar9 < local_110.m_count) && ((uint)lVar18 == local_110.m_a[iVar9])) {
                  iVar9 = iVar9 + 1;
                }
                else {
                  pOVar15 = (local_1e8->m_F).m_a;
                  lVar17 = (long)(int)uVar7;
                  uVar7 = uVar7 + 1;
                  puVar1 = (undefined8 *)((long)pOVar15[1].vi + lVar21);
                  uVar3 = puVar1[1];
                  pOVar15 = pOVar15 + lVar17;
                  *(undefined8 *)pOVar15->vi = *puVar1;
                  *(undefined8 *)(pOVar15->vi + 2) = uVar3;
                  local_1f0 = uVar7;
                }
                lVar18 = lVar18 + 1;
                lVar21 = lVar21 + 0x10;
              } while (lVar18 < (local_1e8->m_F).m_count);
            }
            if ((-1 < (int)local_1f0) && ((int)local_1f0 <= (local_1e8->m_F).m_capacity)) {
              (local_1e8->m_F).m_count = local_1f0;
            }
          }
          if (pOVar11 == (ON_Mesh *)0x0) {
            pOVar11 = (ON_Mesh *)0x0;
          }
          else {
            ON_Mesh::CullUnusedVertices(pOVar11);
          }
        }
        ON_SimpleArray<int>::~ON_SimpleArray(&local_110);
      }
      ON_SimpleArray<double>::~ON_SimpleArray(&local_1a8);
      ON_SimpleArray<double>::~ON_SimpleArray(&local_190);
      return pOVar11;
    }
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh_tools.cpp"
             ,0x355,"","ON_ControlPolygonMesh - surface is not valid");
  return (ON_Mesh *)0x0;
}

Assistant:

ON_Mesh* ON_ControlPolygonMesh(
  const ON_NurbsSurface& nurbs_surface,
  bool bCleanMesh,
  ON_Mesh* input_mesh
)
{
  int u0 = 0;
  int u1 = nurbs_surface.CVCount(0);

  int v0 = 0;
  int v1 = nurbs_surface.CVCount(1);

  if ( 0 == nurbs_surface.m_cv || !nurbs_surface.IsValid() )
  {
    ON_ERROR("ON_ControlPolygonMesh - surface is not valid");
    return nullptr;
  }

  ON_SimpleArray<double> gu(u1);
  ON_SimpleArray<double> gv(v1);
  gu.SetCount(u1);
  gv.SetCount(v1);
  nurbs_surface.GetGrevilleAbcissae(0,gu.Array());
  nurbs_surface.GetGrevilleAbcissae(1,gv.Array());

  ON_Interval d0 = nurbs_surface.Domain(0);
  ON_Interval d1 = nurbs_surface.Domain(1);

  bool bPeriodic0 = nurbs_surface.IsPeriodic(0)?true:false;
  bool bIsClosed0 = bPeriodic0 ? true : (nurbs_surface.IsClosed(0)?true:false);
  bool bPeriodic1 = nurbs_surface.IsPeriodic(1)?true:false;
  bool bIsClosed1 = bPeriodic1 ? true : (nurbs_surface.IsClosed(1)?true:false);

  if ( bPeriodic0 )
  {
    u1 -= (nurbs_surface.Degree(0) - 1);
    while ( u1 < nurbs_surface.CVCount(0) && gu[u0] < d0[0] && gu[u1-1] <= d0[1] )
    {
      u0++;
      u1++;
    }
    d0.Set(gu[u0],gu[u1-1]);
  }

  if ( bPeriodic1 )
  {
    v1 -= (nurbs_surface.Degree(1) - 1);
    while ( v1 < nurbs_surface.CVCount(1) && gv[v0] < d1[0] && gv[v1-1] <= d1[1] )
    {
      v0++;
      v1++;
    }
    d1.Set(gv[v0],gv[v1-1]);
  }


  ON_Mesh* mesh = (0 == input_mesh) ? new ON_Mesh() : input_mesh;

  int vertex_count = (u1-u0)*(v1-v0);
  int face_count = (u1-u0-1)*(v1-v0-1);

  ON_3dPointArray& dpv = mesh->DoublePrecisionVertices();
  dpv.Reserve(vertex_count);
  mesh->m_N.Reserve(vertex_count);
  mesh->m_T.Reserve(vertex_count);
  mesh->m_S.Reserve(vertex_count);
  mesh->m_F.Reserve(face_count);
  mesh->m_srf_domain[0] = d0;
  mesh->m_srf_domain[1] = d1;

  ON_3dPoint V;
  ON_3dVector N;
  ON_2dPoint S;
  ON_2dPoint T;

  int hint[2] = {0,0};
  int i, j;
  int k = -1;
  for ( j = v0; j < v1; j++)
  {
    S.y = gv[j];
    T.y = d1.NormalizedParameterAt(S.y);
    for ( i = u0; i < u1; i++)
    {
      nurbs_surface.GetCV( i, j, V);
      S.x = gu[i];
      T.x = d0.NormalizedParameterAt(S.x);
      nurbs_surface.EvNormal(gu[i],gv[j],N,0,hint);
      dpv.AppendNew() = V;
      mesh->m_N.AppendNew() = N;
      mesh->m_S.AppendNew() = S;
      mesh->m_T.AppendNew() = T;
      if ( i > u0 && j > v0 )
      {
        ON_MeshFace& f = mesh->m_F.AppendNew();
        f.vi[0] = k++;
        f.vi[1] = k;
        f.vi[2] = dpv.Count()-1;
        f.vi[3] = f.vi[2]-1;
      }
    }
    k++;
  }
  
  mesh->UpdateSinglePrecisionVertices();

  u1 -= u0;
  v1 -= v0;

  // make sure closed seams are spot on
  if ( bIsClosed0 )
  {
    i = 0;
    for ( j = 0; j < v1; j++ )
    {
      k = i + (u1-1);
      mesh->SetVertex(k, mesh->Vertex(i));
      if ( bPeriodic0 )
      {
        mesh->m_N[k] = mesh->m_N[i];
      }
      i = k+1;
      // do NOT synch texture coordinates
    }
  }

  if ( bIsClosed1 )
  {
    for ( i = 0, k = u1*(v1-1); i < u1; i++, k++ )
    {
      mesh->SetVertex(k, mesh->Vertex(i));
      if ( bPeriodic1 )
      {
        mesh->m_N[k] = mesh->m_N[i];
      }
      // do NOT synch texture coordinates
    }
  }

  // make sure singular ends are spot on
  i=0;
  for ( k = 0; k < 4; k++ )
  {
    if ( nurbs_surface.IsSingular(k) )
    {
      switch(k)
      {
      case 0: // 0 = south
        i = 0;
        j = 1;
        k = u1;
        break;

      case 1: // 1 = east
        i = u1-1;
        j = u1;
        k = u1*v1;
        break;

      case 2: // 2 = north
        i = u1*(v1-1);
        j = 1;
        k = u1*v1;
        break;

      case 3: // 3 = west
        i = 0;
        j = u1;
        k = u1*(v1-1)+1;
        break;
      }
      V = mesh->Vertex(i);
      for ( i = i+j; i < k; i += j )
      {
        mesh->SetVertex(i, V);
      }
    }
  }

  if ( bCleanMesh )
  {
    // Clean up triangles etc.
    ON_3dPoint P[4];
    ON_SimpleArray<int> badfi(32);
    for ( i = 0; i < mesh->m_F.Count(); i++ )
    {
      ON_MeshFace& f = mesh->m_F[i];
      P[0] = mesh->Vertex(f.vi[0]);
      P[1] = mesh->Vertex(f.vi[1]);
      P[2] = mesh->Vertex(f.vi[2]);
      P[3] = mesh->Vertex(f.vi[3]);
      if ( P[0] == P[1] )
      {
        f.vi[1] = f.vi[2];
        f.vi[2] = f.vi[3];
        P[1] = P[2];
        P[2] = P[3];
      }
      if ( P[1] == P[2] )
      {
        f.vi[2] = f.vi[3];
        P[2] = P[3];
      }
      if ( P[2] == P[3] )
      {
        f.vi[2] = f.vi[3];
        P[2] = P[3];
      }
      if ( P[3] == P[0] )
      {
        f.vi[0] = f.vi[1];
        f.vi[1] = f.vi[2];
        f.vi[2] = f.vi[3];
        P[0] = P[1];
        P[1] = P[2];
        P[2] = P[3];
      }
      if (    f.vi[0] == f.vi[1] 
           || f.vi[1] == f.vi[2] 
           || f.vi[3] == f.vi[0] 
           || P[0] == P[2] || P[1] == P[3] )
      {
        badfi.Append(i);
      }
    }
    
    if ( badfi.Count() > 0 )
    {
      if ( badfi.Count() == mesh->m_F.Count() )
      {
        if ( input_mesh )
        {
          mesh->Destroy();
        }
        else
        {
          delete mesh;
        }
        mesh = 0;
      }
      else
      {
        // remove bad faces
        i = badfi[0];
        j = i+1;
        k = 1;
        for ( j = i+1; j < mesh->m_F.Count(); j++ )
        {
          if ( k < badfi.Count() && j == badfi[k] )
          {
            k++;
          }
          else
          {
            mesh->m_F[i++] = mesh->m_F[j];
          }
        }
        mesh->m_F.SetCount(i);
      }

      // 29 May 2008: Mikko, TRR 34687:
      // Added crash protection. At this point mesh is nullptr if it contained all bad faces.
      if ( mesh)
        mesh->CullUnusedVertices();
    }
  }

  return mesh;
}